

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O2

int QHostInfo::lookupHostImpl
              (QString *name,QObject *receiver,QSlotObjectBase *slotObjRaw,char *member)

{
  QThread *this;
  long lVar1;
  Type *this_00;
  QHostInfoRunnable *this_01;
  int id;
  QObject *this_02;
  long in_FS_OFFSET;
  QObject local_b0 [8];
  QSlotObjectBase *local_a8;
  QObject local_a0 [8];
  QSlotObjectBase *local_98;
  bool valid;
  QObject local_88 [8];
  QSlotObjectBase *local_80;
  QHostInfoResult local_78;
  QHostInfo hostInfo;
  __uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> local_40;
  Chain *local_38;
  
  local_38 = *(Chain **)(in_FS_OFFSET + 0x28);
  local_40._M_t.
  super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
  super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
       (tuple<QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)
       (tuple<QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)slotObjRaw;
  this = (QThread *)QThread::currentThread();
  lVar1 = QAbstractEventDispatcher::instance(this);
  if (lVar1 == 0) {
    local_78.super_QObject = (QObject)0x2;
    local_78._1_3_ = 0;
    local_78.receiver.wp.d._4_4_ = 0;
    local_78._4_4_ = 0;
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    local_78.receiver.wp.d._0_4_ = 0;
    local_78.receiver.wp.value = (QObject *)0x23d1aa;
    QMessageLogger::warning
              ((char *)&local_78,"QHostInfo::lookupHost() called with no event dispatcher");
    id = -1;
    goto LAB_001a20a5;
  }
  qMetaTypeId<QHostInfo>();
  LOCK();
  UNLOCK();
  id = nextId()::counter + 1;
  if ((name->d).size == 0) {
    hostInfo.d_ptr = (QHostInfoPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    nextId()::counter = nextId()::counter + 1;
    QHostInfo(&hostInfo,id);
    (hostInfo.d_ptr)->err = HostNotFound;
    QCoreApplication::translate((char *)&local_78,"QHostInfo","No host name given",0);
    QString::operator=(&(hostInfo.d_ptr)->errorStr,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    local_78.slotObj._M_t.
    super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
    super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
    super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter,_true,_true>
          )&DAT_aaaaaaaaaaaaaaaa;
    local_78.receiver.wp.d._0_4_ = 0xaaaaaaaa;
    local_78.receiver.wp.d._4_4_ = 0xaaaaaaaa;
    local_78.receiver.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.super_QObject = (QObject)0xaa;
    local_78._1_3_ = 0xaaaaaa;
    local_78._4_4_ = 0xaaaaaaaa;
    local_78._8_4_ = 0xaaaaaaaa;
    local_78._12_4_ = 0xaaaaaaaa;
    local_40._M_t.
    super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
    super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
         (tuple<QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)
         (_Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)0x0;
    local_80 = slotObjRaw;
    QHostInfoResult::QHostInfoResult(&local_78,receiver,(SlotObjUniquePtr)&local_80);
    std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
              ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
               &local_80);
    if (member != (char *)0x0) {
      this_02 = local_88;
LAB_001a1fd4:
      QObject::connect(this_02,(char *)&local_78,(QObject *)"2resultsReady(QHostInfo)",
                       (char *)receiver,(ConnectionType)member);
      QMetaObject::Connection::~Connection((Connection *)this_02);
    }
LAB_001a1ff0:
    QHostInfoResult::postResultsReady(&local_78,&hostInfo);
    QHostInfoResult::~QHostInfoResult(&local_78);
    ~QHostInfo(&hostInfo);
  }
  else {
    nextId()::counter = nextId()::counter + 1;
    this_00 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
              ::operator()((QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
                            *)this);
    if (this_00 == (Type *)0x0) goto LAB_001a20a5;
    if (((this_00->cache).enabled._M_base._M_i & 1U) != 0) {
      valid = false;
      hostInfo.d_ptr = (QHostInfoPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QHostInfoCache::get((QHostInfoCache *)&hostInfo,(QString *)this_00,(bool *)name);
      if (valid == true) {
        (hostInfo.d_ptr)->lookupId = id;
        local_78.slotObj._M_t.
        super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
        super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
        super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter,_true,_true>
              )&DAT_aaaaaaaaaaaaaaaa;
        local_78.receiver.wp.d._0_4_ = 0xaaaaaaaa;
        local_78.receiver.wp.d._4_4_ = 0xaaaaaaaa;
        local_78.receiver.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.super_QObject = (QObject)0xaa;
        local_78._1_3_ = 0xaaaaaa;
        local_78._4_4_ = 0xaaaaaaaa;
        local_78._8_4_ = 0xaaaaaaaa;
        local_78._12_4_ = 0xaaaaaaaa;
        local_40._M_t.
        super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
        super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
             (tuple<QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)
             (_Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)
             0x0;
        local_98 = slotObjRaw;
        QHostInfoResult::QHostInfoResult(&local_78,receiver,(SlotObjUniquePtr)&local_98);
        std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::
        ~unique_ptr((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
                    &local_98);
        if (member != (char *)0x0) {
          this_02 = local_a0;
          goto LAB_001a1fd4;
        }
        goto LAB_001a1ff0;
      }
      ~QHostInfo(&hostInfo);
    }
    this_01 = (QHostInfoRunnable *)operator_new(0x58);
    local_40._M_t.
    super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
    super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
         (tuple<QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)
         (_Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)0x0;
    local_a8 = slotObjRaw;
    QHostInfoRunnable::QHostInfoRunnable(this_01,name,id,receiver,(SlotObjUniquePtr)&local_a8);
    std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
              ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
               &local_a8);
    if (member != (char *)0x0) {
      QObject::connect(local_b0,(char *)&this_01->resultEmitter,
                       (QObject *)"2resultsReady(QHostInfo)",(char *)receiver,(ConnectionType)member
                      );
      QMetaObject::Connection::~Connection((Connection *)local_b0);
    }
    QHostInfoLookupManager::scheduleLookup(this_00,this_01);
  }
LAB_001a20a5:
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             &local_40);
  if (*(Chain **)(in_FS_OFFSET + 0x28) == local_38) {
    return id;
  }
  __stack_chk_fail();
}

Assistant:

int QHostInfo::lookupHostImpl(const QString &name,
                              const QObject *receiver,
                              QtPrivate::QSlotObjectBase *slotObjRaw,
                              const char *member)
{
    QtPrivate::SlotObjUniquePtr slotObj{slotObjRaw};
#if defined QHOSTINFO_DEBUG
    qDebug("QHostInfo::lookupHostImpl(\"%s\", %p, %p, %s)",
           name.toLatin1().constData(), receiver, slotObj.get(), member ? member + 1 : 0);
#endif
    Q_ASSERT(!member != !slotObj); // one of these must be set, but not both
    Q_ASSERT(receiver || slotObj);
    Q_ASSERT(!member || receiver); // if member is set, also is receiver
    const bool isUsingStringBasedSlot = static_cast<bool>(member);

    if (!QAbstractEventDispatcher::instance(QThread::currentThread())) {
        qWarning("QHostInfo::lookupHost() called with no event dispatcher");
        return -1;
    }

    qRegisterMetaType<QHostInfo>();

    int id = nextId(); // generate unique ID

    if (Q_UNLIKELY(name.isEmpty())) {
        QHostInfo hostInfo(id);
        hostInfo.setError(QHostInfo::HostNotFound);
        hostInfo.setErrorString(QCoreApplication::translate("QHostInfo", "No host name given"));

        QHostInfoResult result(receiver, std::move(slotObj));
        if (isUsingStringBasedSlot) {
            QObject::connect(&result, SIGNAL(resultsReady(QHostInfo)),
                            receiver, member, Qt::QueuedConnection);
        }
        result.postResultsReady(hostInfo);

        return id;
    }

#ifdef Q_OS_WASM
    // Resolve the host name directly without using a thread or cache,
    // since Emscripten's host lookup is fast. Emscripten maintains an internal
    // mapping of hosts and addresses for the purposes of WebSocket socket
    // tunnelling, and does not perform an actual host lookup.
    QHostInfo hostInfo = QHostInfoAgent::lookup(name);
    hostInfo.setLookupId(id);

    QHostInfoResult result(receiver, std::move(slotObj));
    if (isUsingStringBasedSlot) {
        QObject::connect(&result, SIGNAL(resultsReady(QHostInfo)),
                        receiver, member, Qt::QueuedConnection);
    }
    result.postResultsReady(hostInfo);
#else
    QHostInfoLookupManager *manager = theHostInfoLookupManager();

    if (Q_LIKELY(manager)) {
        // the application is still alive
        if (manager->cache.isEnabled()) {
            // check cache first
            bool valid = false;
            QHostInfo info = manager->cache.get(name, &valid);
            if (valid) {
                info.setLookupId(id);
                QHostInfoResult result(receiver, std::move(slotObj));
                if (isUsingStringBasedSlot) {
                    QObject::connect(&result, SIGNAL(resultsReady(QHostInfo)),
                                    receiver, member, Qt::QueuedConnection);
                }
                result.postResultsReady(info);
                return id;
            }
        }

        // cache is not enabled or it was not in the cache, do normal lookup
        QHostInfoRunnable *runnable = new QHostInfoRunnable(name, id, receiver, std::move(slotObj));
        if (isUsingStringBasedSlot) {
            QObject::connect(&runnable->resultEmitter, SIGNAL(resultsReady(QHostInfo)),
                                receiver, member, Qt::QueuedConnection);
        }
        manager->scheduleLookup(runnable);
    }
#endif // Q_OS_WASM
    return id;
}